

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readline.cpp
# Opt level: O3

ssize_t readline::read(int __fd,void *__buf,size_t __nbytes)

{
  char *prompt;
  bool bVar1;
  char cVar2;
  int iVar3;
  char *__s1;
  undefined7 extraout_var;
  ssize_t sVar4;
  undefined4 in_register_0000003c;
  string *line;
  long lVar5;
  
  line = (string *)CONCAT44(in_register_0000003c,__fd);
  linenoise::LoadHistory(*(char **)__nbytes);
  prompt = *__buf;
  __s1 = getenv("TERM");
  if (__s1 != (char *)0x0) {
    lVar5 = 0;
    do {
      iVar3 = strcasecmp(__s1,*(char **)((long)&linenoise::unsupported_term + lVar5));
      if (iVar3 == 0) {
        printf("%s",prompt);
        fflush(_stdout);
        cVar2 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + 'h');
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)&std::cin,(string *)line,cVar2);
        goto LAB_00105500;
      }
      lVar5 = lVar5 + 8;
    } while (lVar5 != 0x18);
  }
  bVar1 = linenoise::linenoiseRaw(prompt,line);
  if (bVar1) {
    sVar4 = 0;
  }
  else {
LAB_00105500:
    linenoise::AddHistory((line->_M_dataplus)._M_p);
    linenoise::SaveHistory(*(char **)__nbytes);
    sVar4 = CONCAT71(extraout_var,1);
  }
  return sVar4;
}

Assistant:

bool read(std::string& input, const std::string& prompt,
          const std::string& history_path)
{
    linenoise::LoadHistory(history_path.c_str());

    const auto eof = linenoise::Readline(prompt.c_str(), input);

    if (eof)
        return false;

    linenoise::AddHistory(input.c_str());
    linenoise::SaveHistory(history_path.c_str());

    return true;
}